

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O0

void __thiscall AssemblyCode::PatternMatcher::PatternMatcher(PatternMatcher *this)

{
  shared_ptr<IRT::RegPattern> local_1d0;
  shared_ptr<IRT::MemPattern> local_1c0;
  shared_ptr<IRT::ConstPattern> local_1b0;
  shared_ptr<IRT::LabelPattern> local_1a0;
  shared_ptr<IRT::NamePattern> local_190;
  shared_ptr<IRT::ExpPattern> local_180;
  shared_ptr<IRT::JumpPattern> local_170;
  shared_ptr<IRT::RegModRegPattern> local_160;
  shared_ptr<IRT::RegMulRegPattern> local_150;
  shared_ptr<IRT::RegMinusRegPattern> local_140;
  shared_ptr<IRT::RegPlusRegPattern> local_130;
  shared_ptr<IRT::MoveRegRegPattern> local_120;
  shared_ptr<IRT::ConditionalJumpPattern> local_110;
  shared_ptr<IRT::CallPattern> local_100;
  shared_ptr<IRT::ConstPlusRegPattern> local_f0;
  shared_ptr<IRT::RegPlusConstPattern> local_e0;
  shared_ptr<IRT::MoveMemFromConstPattern> local_d0;
  shared_ptr<IRT::MemFromRegPlusConstPattern> local_c0;
  shared_ptr<IRT::MemFromConstPlusRegPattern> local_b0;
  shared_ptr<IRT::MoveRegToMemByConst> local_a0;
  shared_ptr<IRT::MoveRegToMemByReg> local_90;
  shared_ptr<IRT::MoveRegToMemByConstPlusReg> local_80;
  shared_ptr<IRT::MoveRegToMemByRegPlusConst> local_70;
  shared_ptr<IRT::MoveFromMemByRegToMemByReg> local_60;
  shared_ptr<IRT::MemFromConstPlusRegPattern> local_50;
  shared_ptr<IRT::MemFromRegPlusConstPattern> local_40 [2];
  shared_ptr<IRT::MoveFromMemByRegToReg> local_20;
  PatternMatcher *local_10;
  PatternMatcher *this_local;
  
  local_10 = this;
  std::
  vector<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>::
  vector(&this->patterns);
  std::make_shared<IRT::MoveFromMemByRegToReg>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveFromMemByRegToReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_20);
  std::shared_ptr<IRT::MoveFromMemByRegToReg>::~shared_ptr(&local_20);
  std::make_shared<IRT::MemFromRegPlusConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromRegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,local_40);
  std::shared_ptr<IRT::MemFromRegPlusConstPattern>::~shared_ptr(local_40);
  std::make_shared<IRT::MemFromConstPlusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_50);
  std::shared_ptr<IRT::MemFromConstPlusRegPattern>::~shared_ptr(&local_50);
  std::make_shared<IRT::MoveFromMemByRegToMemByReg>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveFromMemByRegToMemByReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_60);
  std::shared_ptr<IRT::MoveFromMemByRegToMemByReg>::~shared_ptr(&local_60);
  std::make_shared<IRT::MoveRegToMemByRegPlusConst>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByRegPlusConst>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_70);
  std::shared_ptr<IRT::MoveRegToMemByRegPlusConst>::~shared_ptr(&local_70);
  std::make_shared<IRT::MoveRegToMemByConstPlusReg>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByConstPlusReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_80);
  std::shared_ptr<IRT::MoveRegToMemByConstPlusReg>::~shared_ptr(&local_80);
  std::make_shared<IRT::MoveRegToMemByReg>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_90);
  std::shared_ptr<IRT::MoveRegToMemByReg>::~shared_ptr(&local_90);
  std::make_shared<IRT::MoveRegToMemByConst>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByConst>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_a0);
  std::shared_ptr<IRT::MoveRegToMemByConst>::~shared_ptr(&local_a0);
  std::make_shared<IRT::MemFromConstPlusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_b0);
  std::shared_ptr<IRT::MemFromConstPlusRegPattern>::~shared_ptr(&local_b0);
  std::make_shared<IRT::MemFromRegPlusConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromRegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_c0);
  std::shared_ptr<IRT::MemFromRegPlusConstPattern>::~shared_ptr(&local_c0);
  std::make_shared<IRT::MoveMemFromConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveMemFromConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_d0);
  std::shared_ptr<IRT::MoveMemFromConstPattern>::~shared_ptr(&local_d0);
  std::make_shared<IRT::RegPlusConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_e0);
  std::shared_ptr<IRT::RegPlusConstPattern>::~shared_ptr(&local_e0);
  std::make_shared<IRT::ConstPlusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_f0);
  std::shared_ptr<IRT::ConstPlusRegPattern>::~shared_ptr(&local_f0);
  std::make_shared<IRT::CallPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::CallPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_100);
  std::shared_ptr<IRT::CallPattern>::~shared_ptr(&local_100);
  std::make_shared<IRT::ConditionalJumpPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConditionalJumpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_110);
  std::shared_ptr<IRT::ConditionalJumpPattern>::~shared_ptr(&local_110);
  std::make_shared<IRT::MoveRegRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_120);
  std::shared_ptr<IRT::MoveRegRegPattern>::~shared_ptr(&local_120);
  std::make_shared<IRT::RegPlusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_130);
  std::shared_ptr<IRT::RegPlusRegPattern>::~shared_ptr(&local_130);
  std::make_shared<IRT::RegMinusRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegMinusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_140);
  std::shared_ptr<IRT::RegMinusRegPattern>::~shared_ptr(&local_140);
  std::make_shared<IRT::RegMulRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegMulRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_150);
  std::shared_ptr<IRT::RegMulRegPattern>::~shared_ptr(&local_150);
  std::make_shared<IRT::RegModRegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegModRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_160);
  std::shared_ptr<IRT::RegModRegPattern>::~shared_ptr(&local_160);
  std::make_shared<IRT::JumpPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::JumpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_170);
  std::shared_ptr<IRT::JumpPattern>::~shared_ptr(&local_170);
  std::make_shared<IRT::ExpPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ExpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_180);
  std::shared_ptr<IRT::ExpPattern>::~shared_ptr(&local_180);
  std::make_shared<IRT::NamePattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::NamePattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_190);
  std::shared_ptr<IRT::NamePattern>::~shared_ptr(&local_190);
  std::make_shared<IRT::LabelPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::LabelPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_1a0);
  std::shared_ptr<IRT::LabelPattern>::~shared_ptr(&local_1a0);
  std::make_shared<IRT::ConstPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_1b0);
  std::shared_ptr<IRT::ConstPattern>::~shared_ptr(&local_1b0);
  std::make_shared<IRT::MemPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_1c0);
  std::shared_ptr<IRT::MemPattern>::~shared_ptr(&local_1c0);
  std::make_shared<IRT::RegPattern>();
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_1d0);
  std::shared_ptr<IRT::RegPattern>::~shared_ptr(&local_1d0);
  return;
}

Assistant:

AssemblyCode::PatternMatcher::PatternMatcher( ) {
    patterns.emplace_back( std::make_shared<IRT::MoveFromMemByRegToReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromRegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveFromMemByRegToMemByReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByRegPlusConst>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByConstPlusReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByConst>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromRegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveMemFromConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::CallPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConditionalJumpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegMinusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegMulRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegModRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::JumpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ExpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::NamePattern>( ));
    patterns.emplace_back( std::make_shared<IRT::LabelPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPattern>( ));
}